

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void iadst16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  __m256i alVar4;
  __m256i alVar5;
  undefined1 auVar6 [32];
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  __m256i in0;
  __m256i in1;
  longlong local_200;
  longlong lStack_1f8;
  longlong lStack_1f0;
  longlong lStack_1e8;
  longlong local_140;
  longlong lStack_138;
  longlong lStack_130;
  longlong lStack_128;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar13 = (long)bit;
  iVar14 = 1 << ((char)bit - 1U & 0x1f);
  iVar1 = LoadMaskz2[lVar13 * 8 + 2][2];
  auVar23._4_4_ = iVar1;
  auVar23._0_4_ = iVar1;
  auVar23._8_4_ = iVar1;
  auVar23._12_4_ = iVar1;
  auVar23._16_4_ = iVar1;
  auVar23._20_4_ = iVar1;
  auVar23._24_4_ = iVar1;
  auVar23._28_4_ = iVar1;
  uVar2 = *(undefined4 *)(&DAT_00b99618 + lVar13 * 0x100);
  auVar39._4_4_ = uVar2;
  auVar39._0_4_ = uVar2;
  auVar39._8_4_ = uVar2;
  auVar39._12_4_ = uVar2;
  auVar39._16_4_ = uVar2;
  auVar39._20_4_ = uVar2;
  auVar39._24_4_ = uVar2;
  auVar39._28_4_ = uVar2;
  iVar1 = LoadMaskz2[lVar13 * 8 + 3][2];
  auVar20._4_4_ = iVar1;
  auVar20._0_4_ = iVar1;
  auVar20._8_4_ = iVar1;
  auVar20._12_4_ = iVar1;
  auVar20._16_4_ = iVar1;
  auVar20._20_4_ = iVar1;
  auVar20._24_4_ = iVar1;
  auVar20._28_4_ = iVar1;
  uVar2 = *(undefined4 *)(&DAT_00b995f8 + lVar13 * 0x20);
  auVar38._4_4_ = uVar2;
  auVar38._0_4_ = uVar2;
  auVar38._8_4_ = uVar2;
  auVar38._12_4_ = uVar2;
  auVar38._16_4_ = uVar2;
  auVar38._20_4_ = uVar2;
  auVar38._24_4_ = uVar2;
  auVar38._28_4_ = uVar2;
  iVar1 = LoadMaskz2[lVar13 * 8 + 4][2];
  auVar28._4_4_ = iVar1;
  auVar28._0_4_ = iVar1;
  auVar28._8_4_ = iVar1;
  auVar28._12_4_ = iVar1;
  auVar28._16_4_ = iVar1;
  auVar28._20_4_ = iVar1;
  auVar28._24_4_ = iVar1;
  auVar28._28_4_ = iVar1;
  iVar1 = LoadMaskz2[lVar13 * 8 + 7][6];
  auVar37._4_4_ = iVar1;
  auVar37._0_4_ = iVar1;
  auVar37._8_4_ = iVar1;
  auVar37._12_4_ = iVar1;
  auVar37._16_4_ = iVar1;
  auVar37._20_4_ = iVar1;
  auVar37._24_4_ = iVar1;
  auVar37._28_4_ = iVar1;
  iVar1 = LoadMaskz2[lVar13 * 8 + 5][2];
  auVar17._4_4_ = iVar1;
  auVar17._0_4_ = iVar1;
  auVar17._8_4_ = iVar1;
  auVar17._12_4_ = iVar1;
  auVar17._16_4_ = iVar1;
  auVar17._20_4_ = iVar1;
  auVar17._24_4_ = iVar1;
  auVar17._28_4_ = iVar1;
  iVar1 = LoadMaskz2[lVar13 * 8 + 6][6];
  auVar44._4_4_ = iVar1;
  auVar44._0_4_ = iVar1;
  auVar44._8_4_ = iVar1;
  auVar44._12_4_ = iVar1;
  auVar44._16_4_ = iVar1;
  auVar44._20_4_ = iVar1;
  auVar44._24_4_ = iVar1;
  auVar44._28_4_ = iVar1;
  iVar1 = LoadMaskz2[lVar13 * 8 + 6][2];
  auVar33._4_4_ = iVar1;
  auVar33._0_4_ = iVar1;
  auVar33._8_4_ = iVar1;
  auVar33._12_4_ = iVar1;
  auVar33._16_4_ = iVar1;
  auVar33._20_4_ = iVar1;
  auVar33._24_4_ = iVar1;
  auVar33._28_4_ = iVar1;
  iVar1 = LoadMaskz2[lVar13 * 8 + 5][6];
  auVar41._4_4_ = iVar1;
  auVar41._0_4_ = iVar1;
  auVar41._8_4_ = iVar1;
  auVar41._12_4_ = iVar1;
  auVar41._16_4_ = iVar1;
  auVar41._20_4_ = iVar1;
  auVar41._24_4_ = iVar1;
  auVar41._28_4_ = iVar1;
  iVar1 = LoadMaskz2[lVar13 * 8 + 7][2];
  auVar26._4_4_ = iVar1;
  auVar26._0_4_ = iVar1;
  auVar26._8_4_ = iVar1;
  auVar26._12_4_ = iVar1;
  auVar26._16_4_ = iVar1;
  auVar26._20_4_ = iVar1;
  auVar26._24_4_ = iVar1;
  auVar26._28_4_ = iVar1;
  auVar36._4_4_ = iVar14;
  auVar36._0_4_ = iVar14;
  auVar36._8_4_ = iVar14;
  auVar36._12_4_ = iVar14;
  auVar36._16_4_ = iVar14;
  auVar36._20_4_ = iVar14;
  auVar36._24_4_ = iVar14;
  auVar36._28_4_ = iVar14;
  auVar19 = vpmulld_avx2((undefined1  [32])in[0xf],auVar23);
  auVar6 = vpmulld_avx2((undefined1  [32])*in,auVar39);
  auVar19 = vpaddd_avx2(auVar19,auVar36);
  auVar19 = vpaddd_avx2(auVar6,auVar19);
  auVar6 = vpmulld_avx2((undefined1  [32])in[0xf],auVar39);
  auVar23 = vpmulld_avx2(auVar23,(undefined1  [32])*in);
  auVar6 = vpaddd_avx2(auVar6,auVar36);
  auVar39 = vpsubd_avx2(auVar6,auVar23);
  auVar6 = vpmulld_avx2((undefined1  [32])in[0xd],auVar20);
  auVar23 = vpmulld_avx2((undefined1  [32])in[2],auVar38);
  auVar6 = vpaddd_avx2(auVar6,auVar36);
  auVar6 = vpaddd_avx2(auVar6,auVar23);
  auVar23 = vpmulld_avx2((undefined1  [32])in[0xd],auVar38);
  auVar20 = vpmulld_avx2(auVar20,(undefined1  [32])in[2]);
  auVar23 = vpaddd_avx2(auVar23,auVar36);
  auVar38 = vpsubd_avx2(auVar23,auVar20);
  auVar23 = vpmulld_avx2((undefined1  [32])in[0xb],auVar28);
  auVar20 = vpmulld_avx2((undefined1  [32])in[4],auVar37);
  auVar23 = vpaddd_avx2(auVar23,auVar36);
  auVar23 = vpaddd_avx2(auVar23,auVar20);
  auVar20 = vpmulld_avx2((undefined1  [32])in[0xb],auVar37);
  auVar28 = vpmulld_avx2(auVar28,(undefined1  [32])in[4]);
  auVar20 = vpaddd_avx2(auVar20,auVar36);
  auVar37 = vpsubd_avx2(auVar20,auVar28);
  auVar20 = vpmulld_avx2((undefined1  [32])in[9],auVar17);
  auVar28 = vpmulld_avx2((undefined1  [32])in[6],auVar44);
  auVar20 = vpaddd_avx2(auVar20,auVar36);
  auVar20 = vpaddd_avx2(auVar28,auVar20);
  auVar28 = vpmulld_avx2((undefined1  [32])in[9],auVar44);
  auVar17 = vpmulld_avx2(auVar17,(undefined1  [32])in[6]);
  auVar28 = vpaddd_avx2(auVar28,auVar36);
  auVar44 = vpsubd_avx2(auVar28,auVar17);
  auVar28 = vpmulld_avx2((undefined1  [32])in[7],auVar33);
  auVar17 = vpmulld_avx2((undefined1  [32])in[8],auVar41);
  auVar28 = vpaddd_avx2(auVar28,auVar36);
  auVar28 = vpaddd_avx2(auVar17,auVar28);
  iVar1 = LoadMaskz2[lVar13 * 8 + 4][6];
  auVar21._4_4_ = iVar1;
  auVar21._0_4_ = iVar1;
  auVar21._8_4_ = iVar1;
  auVar21._12_4_ = iVar1;
  auVar21._16_4_ = iVar1;
  auVar21._20_4_ = iVar1;
  auVar21._24_4_ = iVar1;
  auVar21._28_4_ = iVar1;
  auVar17 = vpmulld_avx2((undefined1  [32])in[7],auVar41);
  auVar33 = vpmulld_avx2(auVar33,(undefined1  [32])in[8]);
  auVar17 = vpaddd_avx2(auVar17,auVar36);
  auVar41 = vpsubd_avx2(auVar17,auVar33);
  auVar17 = vpmulld_avx2((undefined1  [32])in[5],auVar26);
  auVar17 = vpaddd_avx2(auVar17,auVar36);
  auVar33 = vpmulld_avx2((undefined1  [32])in[10],auVar21);
  auVar17 = vpaddd_avx2(auVar33,auVar17);
  auVar33 = vpmulld_avx2((undefined1  [32])in[5],auVar21);
  uVar2 = *(undefined4 *)(&DAT_00b995e8 + lVar13 * 0x20);
  auVar29._4_4_ = uVar2;
  auVar29._0_4_ = uVar2;
  auVar29._8_4_ = uVar2;
  auVar29._12_4_ = uVar2;
  auVar29._16_4_ = uVar2;
  auVar29._20_4_ = uVar2;
  auVar29._24_4_ = uVar2;
  auVar29._28_4_ = uVar2;
  auVar21 = vpmulld_avx2(auVar26,(undefined1  [32])in[10]);
  auVar33 = vpaddd_avx2(auVar33,auVar36);
  auVar31 = vpsubd_avx2(auVar33,auVar21);
  auVar33 = vpmulld_avx2((undefined1  [32])in[3],auVar29);
  auVar33 = vpaddd_avx2(auVar33,auVar36);
  iVar1 = LoadMaskz2[lVar13 * 8 + 3][6];
  auVar27._4_4_ = iVar1;
  auVar27._0_4_ = iVar1;
  auVar27._8_4_ = iVar1;
  auVar27._12_4_ = iVar1;
  auVar27._16_4_ = iVar1;
  auVar27._20_4_ = iVar1;
  auVar27._24_4_ = iVar1;
  auVar27._28_4_ = iVar1;
  auVar21 = vpmulld_avx2((undefined1  [32])in[0xc],auVar27);
  auVar33 = vpaddd_avx2(auVar21,auVar33);
  auVar21 = vpmulld_avx2((undefined1  [32])in[3],auVar27);
  auVar26 = vpmulld_avx2(auVar29,(undefined1  [32])in[0xc]);
  auVar21 = vpaddd_avx2(auVar21,auVar36);
  uVar2 = *(undefined4 *)(&DAT_00b99608 + lVar13 * 0x20);
  auVar34._4_4_ = uVar2;
  auVar34._0_4_ = uVar2;
  auVar34._8_4_ = uVar2;
  auVar34._12_4_ = uVar2;
  auVar34._16_4_ = uVar2;
  auVar34._20_4_ = uVar2;
  auVar34._24_4_ = uVar2;
  auVar34._28_4_ = uVar2;
  auVar29 = vpsubd_avx2(auVar21,auVar26);
  auVar21 = vpmulld_avx2((undefined1  [32])in[1],auVar34);
  auVar21 = vpaddd_avx2(auVar21,auVar36);
  iVar1 = LoadMaskz2[lVar13 * 8 + 2][6];
  auVar46._4_4_ = iVar1;
  auVar46._0_4_ = iVar1;
  auVar46._8_4_ = iVar1;
  auVar46._12_4_ = iVar1;
  auVar46._16_4_ = iVar1;
  auVar46._20_4_ = iVar1;
  auVar46._24_4_ = iVar1;
  auVar46._28_4_ = iVar1;
  auVar26 = vpmulld_avx2((undefined1  [32])in[0xe],auVar46);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar26 = vpmulld_avx2((undefined1  [32])in[1],auVar46);
  auVar27 = vpmulld_avx2(auVar34,(undefined1  [32])in[0xe]);
  auVar26 = vpaddd_avx2(auVar26,auVar36);
  auVar34 = vpsubd_avx2(auVar26,auVar27);
  auVar26 = vpsrad_avx2(auVar19,ZEXT416((uint)bit));
  auVar28 = vpsrad_avx2(auVar28,ZEXT416((uint)bit));
  auVar19 = vpaddd_avx2(auVar28,auVar26);
  auVar46 = vpsubd_avx2(auVar26,auVar28);
  auVar25 = ZEXT416((uint)bit);
  auVar26 = vpsrad_avx2(auVar39,auVar25);
  auVar27 = vpsrad_avx2(auVar41,auVar25);
  auVar28 = vpaddd_avx2(auVar27,auVar26);
  auVar39 = vpsubd_avx2(auVar26,auVar27);
  auVar26 = vpsrad_avx2(auVar6,auVar25);
  auVar17 = vpsrad_avx2(auVar17,auVar25);
  auVar6 = vpaddd_avx2(auVar17,auVar26);
  auVar41 = vpsubd_avx2(auVar26,auVar17);
  auVar25 = ZEXT416((uint)bit);
  auVar26 = vpsrad_avx2(auVar38,auVar25);
  auVar27 = vpsrad_avx2(auVar31,auVar25);
  auVar17 = vpaddd_avx2(auVar27,auVar26);
  auVar38 = vpsubd_avx2(auVar26,auVar27);
  auVar26 = vpsrad_avx2(auVar23,auVar25);
  auVar33 = vpsrad_avx2(auVar33,auVar25);
  auVar23 = vpaddd_avx2(auVar33,auVar26);
  auVar31 = vpsubd_avx2(auVar26,auVar33);
  auVar26 = vpsrad_avx2(auVar37,auVar25);
  auVar27 = vpsrad_avx2(auVar29,auVar25);
  auVar33 = vpaddd_avx2(auVar27,auVar26);
  auVar37 = vpsubd_avx2(auVar26,auVar27);
  auVar26 = vpsrad_avx2(auVar20,auVar25);
  auVar21 = vpsrad_avx2(auVar21,auVar25);
  auVar20 = vpaddd_avx2(auVar21,auVar26);
  auVar29 = vpsubd_avx2(auVar26,auVar21);
  auVar25 = ZEXT416((uint)bit);
  auVar26 = vpsrad_avx2(auVar44,auVar25);
  auVar27 = vpsrad_avx2(auVar34,auVar25);
  auVar21 = vpaddd_avx2(auVar27,auVar26);
  auVar26 = vpsubd_avx2(auVar26,auVar27);
  iVar1 = *(int *)(&DAT_00b99600 + lVar13 * 0x20);
  iVar16 = -iVar1;
  iVar14 = LoadMaskz2[lVar13 * 8 + 5][0];
  iVar3 = *(int *)(&DAT_00b995e0 + lVar13 * 0x20);
  iVar15 = -iVar14;
  iVar12 = -iVar3;
  iVar10 = bd + (uint)(do_cols == 0) * 2;
  iVar11 = 0x8000;
  if (0xf < iVar10 + 6) {
    iVar11 = 1 << ((char)iVar10 + 5U & 0x1f);
  }
  iVar10 = -iVar11;
  iVar11 = iVar11 + -1;
  auVar40._4_4_ = iVar1;
  auVar40._0_4_ = iVar1;
  auVar40._8_4_ = iVar1;
  auVar40._12_4_ = iVar1;
  auVar40._16_4_ = iVar1;
  auVar40._20_4_ = iVar1;
  auVar40._24_4_ = iVar1;
  auVar40._28_4_ = iVar1;
  auVar18._4_4_ = iVar10;
  auVar18._0_4_ = iVar10;
  auVar18._8_4_ = iVar10;
  auVar18._12_4_ = iVar10;
  auVar18._16_4_ = iVar10;
  auVar18._20_4_ = iVar10;
  auVar18._24_4_ = iVar10;
  auVar18._28_4_ = iVar10;
  auVar30._4_4_ = iVar11;
  auVar30._0_4_ = iVar11;
  auVar30._8_4_ = iVar11;
  auVar30._12_4_ = iVar11;
  auVar30._16_4_ = iVar11;
  auVar30._20_4_ = iVar11;
  auVar30._24_4_ = iVar11;
  auVar30._28_4_ = iVar11;
  auVar27 = vpmaxsd_avx2(auVar46,auVar18);
  auVar44 = vpminsd_avx2(auVar27,auVar30);
  auVar27 = vpmaxsd_avx2(auVar39,auVar18);
  auVar39 = vpminsd_avx2(auVar27,auVar30);
  iVar1 = LoadMaskz2[lVar13 * 8 + 3][0];
  auVar35._4_4_ = iVar1;
  auVar35._0_4_ = iVar1;
  auVar35._8_4_ = iVar1;
  auVar35._12_4_ = iVar1;
  auVar35._16_4_ = iVar1;
  auVar35._20_4_ = iVar1;
  auVar35._24_4_ = iVar1;
  auVar35._28_4_ = iVar1;
  auVar27 = vpmulld_avx2(auVar44,auVar35);
  auVar27 = vpaddd_avx2(auVar27,auVar36);
  auVar34 = vpmulld_avx2(auVar39,auVar40);
  auVar27 = vpaddd_avx2(auVar34,auVar27);
  auVar44 = vpmulld_avx2(auVar44,auVar40);
  auVar34 = vpmulld_avx2(auVar35,auVar39);
  auVar39 = vpaddd_avx2(auVar44,auVar36);
  auVar34 = vpsubd_avx2(auVar39,auVar34);
  auVar32._4_4_ = iVar14;
  auVar32._0_4_ = iVar14;
  auVar32._8_4_ = iVar14;
  auVar32._12_4_ = iVar14;
  auVar32._16_4_ = iVar14;
  auVar32._20_4_ = iVar14;
  auVar32._24_4_ = iVar14;
  auVar32._28_4_ = iVar14;
  auVar39 = vpmaxsd_avx2(auVar41,auVar18);
  auVar44 = vpminsd_avx2(auVar39,auVar30);
  auVar39 = vpmaxsd_avx2(auVar38,auVar18);
  auVar38 = vpminsd_avx2(auVar39,auVar30);
  iVar1 = LoadMaskz2[lVar13 * 8 + 7][0];
  auVar45._4_4_ = iVar1;
  auVar45._0_4_ = iVar1;
  auVar45._8_4_ = iVar1;
  auVar45._12_4_ = iVar1;
  auVar45._16_4_ = iVar1;
  auVar45._20_4_ = iVar1;
  auVar45._24_4_ = iVar1;
  auVar45._28_4_ = iVar1;
  auVar39 = vpmulld_avx2(auVar44,auVar45);
  auVar39 = vpaddd_avx2(auVar39,auVar36);
  auVar41 = vpmulld_avx2(auVar38,auVar32);
  auVar39 = vpaddd_avx2(auVar39,auVar41);
  auVar44 = vpmulld_avx2(auVar44,auVar32);
  auVar41 = vpmulld_avx2(auVar45,auVar38);
  auVar38 = vpaddd_avx2(auVar44,auVar36);
  auVar46 = vpsubd_avx2(auVar38,auVar41);
  auVar42._4_4_ = iVar16;
  auVar42._0_4_ = iVar16;
  auVar42._8_4_ = iVar16;
  auVar42._12_4_ = iVar16;
  auVar42._16_4_ = iVar16;
  auVar42._20_4_ = iVar16;
  auVar42._24_4_ = iVar16;
  auVar42._28_4_ = iVar16;
  auVar38 = vpmaxsd_avx2(auVar31,auVar18);
  auVar44 = vpminsd_avx2(auVar38,auVar30);
  auVar38 = vpmaxsd_avx2(auVar37,auVar18);
  auVar37 = vpminsd_avx2(auVar38,auVar30);
  auVar38 = vpmulld_avx2(auVar44,auVar42);
  auVar38 = vpaddd_avx2(auVar38,auVar36);
  auVar41 = vpmulld_avx2(auVar37,auVar35);
  auVar38 = vpaddd_avx2(auVar41,auVar38);
  auVar44 = vpmulld_avx2(auVar44,auVar35);
  auVar41 = vpmulld_avx2(auVar42,auVar37);
  auVar37 = vpaddd_avx2(auVar44,auVar36);
  auVar31 = vpsubd_avx2(auVar37,auVar41);
  auVar43._4_4_ = iVar15;
  auVar43._0_4_ = iVar15;
  auVar43._8_4_ = iVar15;
  auVar43._12_4_ = iVar15;
  auVar43._16_4_ = iVar15;
  auVar43._20_4_ = iVar15;
  auVar43._24_4_ = iVar15;
  auVar43._28_4_ = iVar15;
  auVar37 = vpmaxsd_avx2(auVar18,auVar29);
  auVar37 = vpminsd_avx2(auVar37,auVar30);
  auVar26 = vpmaxsd_avx2(auVar26,auVar18);
  auVar44 = vpminsd_avx2(auVar26,auVar30);
  auVar26 = vpmulld_avx2(auVar37,auVar43);
  auVar26 = vpaddd_avx2(auVar26,auVar36);
  auVar41 = vpmulld_avx2(auVar44,auVar45);
  auVar26 = vpaddd_avx2(auVar26,auVar41);
  auVar37 = vpmulld_avx2(auVar37,auVar45);
  auVar44 = vpmulld_avx2(auVar43,auVar44);
  auVar37 = vpaddd_avx2(auVar37,auVar36);
  auVar44 = vpsubd_avx2(auVar37,auVar44);
  auVar19 = vpmaxsd_avx2(auVar18,auVar19);
  auVar37 = vpminsd_avx2(auVar19,auVar30);
  auVar19 = vpmaxsd_avx2(auVar18,auVar23);
  auVar23 = vpminsd_avx2(auVar19,auVar30);
  auVar19 = vpaddd_avx2(auVar23,auVar37);
  auVar41 = vpsubd_avx2(auVar37,auVar23);
  auVar23 = vpmaxsd_avx2(auVar18,auVar28);
  auVar28 = vpminsd_avx2(auVar23,auVar30);
  auVar23 = vpmaxsd_avx2(auVar18,auVar33);
  auVar33 = vpminsd_avx2(auVar23,auVar30);
  auVar23 = vpaddd_avx2(auVar33,auVar28);
  auVar29 = vpsubd_avx2(auVar28,auVar33);
  auVar6 = vpmaxsd_avx2(auVar18,auVar6);
  auVar28 = vpminsd_avx2(auVar6,auVar30);
  auVar6 = vpmaxsd_avx2(auVar18,auVar20);
  auVar20 = vpminsd_avx2(auVar6,auVar30);
  auVar6 = vpaddd_avx2(auVar20,auVar28);
  auVar32 = vpsubd_avx2(auVar28,auVar20);
  auVar20 = vpmaxsd_avx2(auVar18,auVar17);
  auVar28 = vpminsd_avx2(auVar20,auVar30);
  auVar20 = vpmaxsd_avx2(auVar18,auVar21);
  auVar33 = vpsrad_avx2(auVar27,auVar25);
  auVar21 = vpsrad_avx2(auVar34,auVar25);
  auVar27 = vpsrad_avx2(auVar39,auVar25);
  auVar39 = vpsrad_avx2(auVar46,auVar25);
  auVar17 = vpminsd_avx2(auVar20,auVar30);
  auVar38 = vpsrad_avx2(auVar38,auVar25);
  auVar20 = vpaddd_avx2(auVar28,auVar17);
  auVar34 = vpsubd_avx2(auVar28,auVar17);
  auVar37 = vpsrad_avx2(auVar31,auVar25);
  auVar28 = vpaddd_avx2(auVar38,auVar33);
  auVar31 = vpsubd_avx2(auVar33,auVar38);
  auVar26 = vpsrad_avx2(auVar26,auVar25);
  auVar17 = vpaddd_avx2(auVar21,auVar37);
  auVar46 = vpsubd_avx2(auVar21,auVar37);
  auVar38 = vpsrad_avx2(auVar44,auVar25);
  auVar33 = vpaddd_avx2(auVar26,auVar27);
  auVar35 = vpsubd_avx2(auVar27,auVar26);
  auVar21 = vpaddd_avx2(auVar39,auVar38);
  auVar40 = vpsubd_avx2(auVar39,auVar38);
  auVar24._4_4_ = iVar3;
  auVar24._0_4_ = iVar3;
  auVar24._8_4_ = iVar3;
  auVar24._12_4_ = iVar3;
  auVar24._16_4_ = iVar3;
  auVar24._20_4_ = iVar3;
  auVar24._24_4_ = iVar3;
  auVar24._28_4_ = iVar3;
  auVar26 = vpmaxsd_avx2(auVar18,auVar41);
  auVar27 = vpminsd_avx2(auVar26,auVar30);
  auVar26 = vpmaxsd_avx2(auVar29,auVar18);
  auVar39 = vpminsd_avx2(auVar26,auVar30);
  iVar1 = LoadMaskz2[lVar13 * 8 + 4][0];
  auVar47._4_4_ = iVar1;
  auVar47._0_4_ = iVar1;
  auVar47._8_4_ = iVar1;
  auVar47._12_4_ = iVar1;
  auVar47._16_4_ = iVar1;
  auVar47._20_4_ = iVar1;
  auVar47._24_4_ = iVar1;
  auVar47._28_4_ = iVar1;
  auVar26 = vpmulld_avx2(auVar27,auVar47);
  auVar26 = vpaddd_avx2(auVar26,auVar36);
  auVar38 = vpmulld_avx2(auVar39,auVar24);
  auVar26 = vpaddd_avx2(auVar26,auVar38);
  auVar27 = vpmulld_avx2(auVar27,auVar24);
  auVar39 = vpmulld_avx2(auVar47,auVar39);
  auVar27 = vpaddd_avx2(auVar27,auVar36);
  auVar29 = vpsubd_avx2(auVar27,auVar39);
  auVar22._4_4_ = iVar12;
  auVar22._0_4_ = iVar12;
  auVar22._8_4_ = iVar12;
  auVar22._12_4_ = iVar12;
  auVar22._16_4_ = iVar12;
  auVar22._20_4_ = iVar12;
  auVar22._24_4_ = iVar12;
  auVar22._28_4_ = iVar12;
  auVar27 = vpmaxsd_avx2(auVar32,auVar18);
  auVar39 = vpminsd_avx2(auVar27,auVar30);
  auVar27 = vpmaxsd_avx2(auVar34,auVar18);
  auVar38 = vpminsd_avx2(auVar27,auVar30);
  auVar27 = vpmulld_avx2(auVar39,auVar22);
  auVar27 = vpaddd_avx2(auVar27,auVar36);
  auVar37 = vpmulld_avx2(auVar38,auVar47);
  auVar27 = vpaddd_avx2(auVar27,auVar37);
  auVar39 = vpmulld_avx2(auVar39,auVar47);
  auVar38 = vpmulld_avx2(auVar22,auVar38);
  auVar39 = vpaddd_avx2(auVar39,auVar36);
  auVar34 = vpsubd_avx2(auVar39,auVar38);
  auVar39 = vpmaxsd_avx2(auVar31,auVar18);
  auVar38 = vpminsd_avx2(auVar39,auVar30);
  auVar39 = vpmaxsd_avx2(auVar46,auVar18);
  auVar37 = vpminsd_avx2(auVar39,auVar30);
  auVar39 = vpmulld_avx2(auVar38,auVar47);
  auVar39 = vpaddd_avx2(auVar39,auVar36);
  auVar44 = vpmulld_avx2(auVar37,auVar24);
  auVar39 = vpaddd_avx2(auVar39,auVar44);
  auVar38 = vpmulld_avx2(auVar38,auVar24);
  auVar37 = vpmulld_avx2(auVar47,auVar37);
  auVar38 = vpaddd_avx2(auVar38,auVar36);
  auVar31 = vpsubd_avx2(auVar38,auVar37);
  auVar38 = vpmaxsd_avx2(auVar18,auVar35);
  auVar37 = vpminsd_avx2(auVar38,auVar30);
  auVar38 = vpmaxsd_avx2(auVar40,auVar18);
  auVar44 = vpminsd_avx2(auVar38,auVar30);
  auVar38 = vpmulld_avx2(auVar37,auVar22);
  auVar38 = vpaddd_avx2(auVar38,auVar36);
  auVar41 = vpmulld_avx2(auVar44,auVar47);
  auVar38 = vpaddd_avx2(auVar41,auVar38);
  auVar37 = vpmulld_avx2(auVar37,auVar47);
  auVar44 = vpmulld_avx2(auVar22,auVar44);
  auVar37 = vpaddd_avx2(auVar37,auVar36);
  auVar44 = vpsubd_avx2(auVar37,auVar44);
  auVar19 = vpmaxsd_avx2(auVar18,auVar19);
  auVar37 = vpminsd_avx2(auVar19,auVar30);
  auVar19 = vpmaxsd_avx2(auVar18,auVar6);
  auVar6 = vpminsd_avx2(auVar19,auVar30);
  auVar19 = vpaddd_avx2(auVar6,auVar37);
  auVar41 = vpsubd_avx2(auVar37,auVar6);
  auVar6 = vpmaxsd_avx2(auVar18,auVar23);
  auVar23 = vpminsd_avx2(auVar6,auVar30);
  auVar6 = vpmaxsd_avx2(auVar18,auVar20);
  auVar26 = vpsrad_avx2(auVar26,auVar25);
  auVar20 = vpminsd_avx2(auVar6,auVar30);
  auVar37 = vpsrad_avx2(auVar29,auVar25);
  auVar6 = vpaddd_avx2(auVar20,auVar23);
  auVar29 = vpsubd_avx2(auVar23,auVar20);
  auVar20 = vpsrad_avx2(auVar27,auVar25);
  auVar23 = vpaddd_avx2(auVar26,auVar20);
  auVar46 = vpsubd_avx2(auVar26,auVar20);
  auVar26 = vpsrad_avx2(auVar34,auVar25);
  auVar20 = vpaddd_avx2(auVar37,auVar26);
  auVar37 = vpsubd_avx2(auVar37,auVar26);
  auVar28 = vpmaxsd_avx2(auVar18,auVar28);
  auVar26 = vpminsd_avx2(auVar28,auVar30);
  auVar28 = vpmaxsd_avx2(auVar18,auVar33);
  auVar33 = vpminsd_avx2(auVar28,auVar30);
  auVar28 = vpaddd_avx2(auVar33,auVar26);
  auVar34 = vpsubd_avx2(auVar26,auVar33);
  auVar17 = vpmaxsd_avx2(auVar18,auVar17);
  auVar33 = vpminsd_avx2(auVar17,auVar30);
  auVar17 = vpmaxsd_avx2(auVar18,auVar21);
  auVar26 = vpsrad_avx2(auVar39,auVar25);
  auVar21 = vpminsd_avx2(auVar17,auVar30);
  auVar27 = vpsrad_avx2(auVar31,auVar25);
  auVar17 = vpaddd_avx2(auVar33,auVar21);
  auVar31 = vpsubd_avx2(auVar33,auVar21);
  auVar25 = ZEXT416((uint)bit);
  auVar21 = vpsrad_avx2(auVar38,auVar25);
  auVar33 = vpaddd_avx2(auVar21,auVar26);
  auVar32 = vpsubd_avx2(auVar26,auVar21);
  auVar26 = vpsrad_avx2(auVar44,auVar25);
  auVar21 = vpaddd_avx2(auVar26,auVar27);
  auVar35 = vpsubd_avx2(auVar27,auVar26);
  auVar19 = vpmaxsd_avx2(auVar19,auVar18);
  auVar26 = vpmaxsd_avx2(auVar41,auVar18);
  auVar6 = vpmaxsd_avx2(auVar6,auVar18);
  auVar27 = vpmaxsd_avx2(auVar18,auVar29);
  auVar23 = vpmaxsd_avx2(auVar23,auVar18);
  auVar39 = vpmaxsd_avx2(auVar18,auVar46);
  auVar20 = vpmaxsd_avx2(auVar20,auVar18);
  auVar38 = vpmaxsd_avx2(auVar18,auVar37);
  auVar28 = vpmaxsd_avx2(auVar18,auVar28);
  auVar37 = vpmaxsd_avx2(auVar18,auVar34);
  auVar17 = vpmaxsd_avx2(auVar18,auVar17);
  auVar44 = vpmaxsd_avx2(auVar18,auVar31);
  auVar33 = vpmaxsd_avx2(auVar18,auVar33);
  auVar41 = vpmaxsd_avx2(auVar18,auVar32);
  auVar21 = vpmaxsd_avx2(auVar21,auVar18);
  auVar31 = vpmaxsd_avx2(auVar35,auVar18);
  alVar4 = (__m256i)vpminsd_avx2(auVar19,auVar30);
  auVar19 = vpminsd_avx2(auVar30,auVar26);
  auVar26 = vpminsd_avx2(auVar6,auVar30);
  auVar6 = vpminsd_avx2(auVar27,auVar30);
  auVar27 = vpminsd_avx2(auVar23,auVar30);
  auVar23 = vpminsd_avx2(auVar39,auVar30);
  auVar39 = vpminsd_avx2(auVar20,auVar30);
  auVar20 = vpminsd_avx2(auVar38,auVar30);
  auVar28 = vpminsd_avx2(auVar28,auVar30);
  auVar38 = vpminsd_avx2(auVar37,auVar30);
  alVar5 = (__m256i)vpminsd_avx2(auVar30,auVar17);
  auVar17 = vpminsd_avx2(auVar30,auVar44);
  auVar33 = vpminsd_avx2(auVar30,auVar33);
  auVar37 = vpminsd_avx2(auVar30,auVar41);
  in1 = (__m256i)vpminsd_avx2(auVar21,auVar30);
  auVar21 = vpminsd_avx2(auVar31,auVar30);
  iVar1 = LoadMaskz2[lVar13 * 8 + 6][0];
  auVar31._4_4_ = iVar1;
  auVar31._0_4_ = iVar1;
  auVar31._8_4_ = iVar1;
  auVar31._12_4_ = iVar1;
  auVar31._16_4_ = iVar1;
  auVar31._20_4_ = iVar1;
  auVar31._24_4_ = iVar1;
  auVar31._28_4_ = iVar1;
  auVar19 = vpmulld_avx2(auVar19,auVar31);
  auVar44 = vpmulld_avx2(auVar6,auVar31);
  auVar19 = vpaddd_avx2(auVar19,auVar36);
  auVar6 = vpaddd_avx2(auVar19,auVar44);
  auVar44 = vpsubd_avx2(auVar19,auVar44);
  auVar19 = vpmulld_avx2(auVar23,auVar31);
  auVar20 = vpmulld_avx2(auVar20,auVar31);
  auVar19 = vpaddd_avx2(auVar19,auVar36);
  auVar23 = vpaddd_avx2(auVar20,auVar19);
  auVar41 = vpsubd_avx2(auVar19,auVar20);
  auVar19 = vpmulld_avx2(auVar38,auVar31);
  auVar17 = vpmulld_avx2(auVar17,auVar31);
  auVar19 = vpaddd_avx2(auVar19,auVar36);
  auVar20 = vpaddd_avx2(auVar19,auVar17);
  auVar38 = vpsubd_avx2(auVar19,auVar17);
  auVar19 = vpmulld_avx2(auVar37,auVar31);
  auVar17 = vpmulld_avx2(auVar21,auVar31);
  auVar21 = vpsrad_avx2(auVar6,auVar25);
  alVar7 = (__m256i)vpsrad_avx2(auVar44,auVar25);
  in0 = (__m256i)vpsrad_avx2(auVar23,auVar25);
  auVar23 = vpsrad_avx2(auVar41,auVar25);
  alVar8 = (__m256i)vpsrad_avx2(auVar20,auVar25);
  auVar20 = vpsrad_avx2(auVar38,auVar25);
  auVar19 = vpaddd_avx2(auVar19,auVar36);
  auVar6 = vpaddd_avx2(auVar19,auVar17);
  auVar6 = vpsrad_avx2(auVar6,auVar25);
  auVar19 = vpsubd_avx2(auVar19,auVar17);
  alVar9 = (__m256i)vpsrad_avx2(auVar19,auVar25);
  if (do_cols == 0) {
    iVar1 = 10;
    if (10 < bd) {
      iVar1 = bd;
    }
    local_a0 = 0x20 << ((byte)iVar1 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    neg_shift_avx2(in0,in1,out,out + 1,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 2,out + 3,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 4,out + 5,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 6,out + 7,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 8,out + 9,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 10,out + 0xb,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 0xc,out + 0xd,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 0xe,out + 0xf,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
  }
  else {
    *out = alVar4;
    auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar4 = (__m256i)vpsubd_avx2(auVar19,auVar28);
    out[1] = alVar4;
    local_200 = auVar33._0_8_;
    lStack_1f8 = auVar33._8_8_;
    lStack_1f0 = auVar33._16_8_;
    lStack_1e8 = auVar33._24_8_;
    out[2][0] = local_200;
    out[2][1] = lStack_1f8;
    out[2][2] = lStack_1f0;
    out[2][3] = lStack_1e8;
    alVar4 = (__m256i)vpsubd_avx2(auVar19,auVar27);
    out[3] = alVar4;
    out[4][0] = in0[0];
    out[4][1] = in0[1];
    out[4][2] = in0[2];
    out[4][3] = in0[3];
    alVar4 = (__m256i)vpsubd_avx2(auVar19,auVar6);
    out[5] = alVar4;
    out[6] = alVar8;
    alVar4 = (__m256i)vpsubd_avx2(auVar19,auVar21);
    out[7] = alVar4;
    out[8] = alVar7;
    alVar4 = (__m256i)vpsubd_avx2(auVar19,auVar20);
    out[9] = alVar4;
    out[10] = alVar9;
    alVar4 = (__m256i)vpsubd_avx2(auVar19,auVar23);
    out[0xb] = alVar4;
    local_140 = auVar39._0_8_;
    lStack_138 = auVar39._8_8_;
    lStack_130 = auVar39._16_8_;
    lStack_128 = auVar39._24_8_;
    out[0xc][0] = local_140;
    out[0xc][1] = lStack_138;
    out[0xc][2] = lStack_130;
    out[0xc][3] = lStack_128;
    alVar4 = (__m256i)vpsubd_avx2(auVar19,(undefined1  [32])in1);
    out[0xd] = alVar4;
    out[0xe] = alVar5;
    alVar4 = (__m256i)vpsubd_avx2(auVar19,auVar26);
    out[0xf] = alVar4;
  }
  return;
}

Assistant:

static void iadst16_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);

  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  __m256i cospi_p02_p62 = pair_set_w16_epi16(cospi[2], cospi[62]);
  __m256i cospi_p62_m02 = pair_set_w16_epi16(cospi[62], -cospi[2]);
  __m256i cospi_p10_p54 = pair_set_w16_epi16(cospi[10], cospi[54]);
  __m256i cospi_p54_m10 = pair_set_w16_epi16(cospi[54], -cospi[10]);
  __m256i cospi_p18_p46 = pair_set_w16_epi16(cospi[18], cospi[46]);
  __m256i cospi_p46_m18 = pair_set_w16_epi16(cospi[46], -cospi[18]);
  __m256i cospi_p26_p38 = pair_set_w16_epi16(cospi[26], cospi[38]);
  __m256i cospi_p38_m26 = pair_set_w16_epi16(cospi[38], -cospi[26]);
  __m256i cospi_p34_p30 = pair_set_w16_epi16(cospi[34], cospi[30]);
  __m256i cospi_p30_m34 = pair_set_w16_epi16(cospi[30], -cospi[34]);
  __m256i cospi_p42_p22 = pair_set_w16_epi16(cospi[42], cospi[22]);
  __m256i cospi_p22_m42 = pair_set_w16_epi16(cospi[22], -cospi[42]);
  __m256i cospi_p50_p14 = pair_set_w16_epi16(cospi[50], cospi[14]);
  __m256i cospi_p14_m50 = pair_set_w16_epi16(cospi[14], -cospi[50]);
  __m256i cospi_p58_p06 = pair_set_w16_epi16(cospi[58], cospi[6]);
  __m256i cospi_p06_m58 = pair_set_w16_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m256i x1[16];
  x1[0] = input[15];
  x1[1] = input[0];
  x1[2] = input[13];
  x1[3] = input[2];
  x1[4] = input[11];
  x1[5] = input[4];
  x1[6] = input[9];
  x1[7] = input[6];
  x1[8] = input[7];
  x1[9] = input[8];
  x1[10] = input[5];
  x1[11] = input[10];
  x1[12] = input[3];
  x1[13] = input[12];
  x1[14] = input[1];
  x1[15] = input[14];

  // stage 2
  btf_16_w16_avx2(cospi_p02_p62, cospi_p62_m02, &x1[0], &x1[1], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p10_p54, cospi_p54_m10, &x1[2], &x1[3], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p18_p46, cospi_p46_m18, &x1[4], &x1[5], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p26_p38, cospi_p38_m26, &x1[6], &x1[7], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p34_p30, cospi_p30_m34, &x1[8], &x1[9], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p42_p22, cospi_p22_m42, &x1[10], &x1[11], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p50_p14, cospi_p14_m50, &x1[12], &x1[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p58_p06, cospi_p06_m58, &x1[14], &x1[15], _r,
                  INV_COS_BIT);

  iadst16_stage3_avx2(x1);
  iadst16_stage4_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage5_avx2(x1);
  iadst16_stage6_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage7_avx2(x1);
  iadst16_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage9_avx2(output, x1);
}